

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O2

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildConstraintMatrix
          (BoundingBoxProjectionConstraint *this)

{
  Polygon2D *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  Vector2 *pVVar6;
  double *pdVar7;
  ulong idx;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = &this->projectedBoundingBox;
  sVar5 = Polygon2D::getNrOfVertices(this_00);
  iDynTree::MatrixDynSize::resize((ulong)&this->A,sVar5);
  Polygon2D::getNrOfVertices(this_00);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  idx = 0;
  while( true ) {
    sVar5 = Polygon2D::getNrOfVertices(this_00);
    if (sVar5 <= idx) break;
    pVVar6 = Polygon2D::operator()(this_00,idx);
    dVar1 = pVVar6->m_data[0];
    dVar2 = pVVar6->m_data[1];
    sVar5 = Polygon2D::getNrOfVertices(this_00);
    if (idx == sVar5 - 1) {
      pVVar6 = Polygon2D::operator()(this_00,0);
    }
    else {
      pVVar6 = Polygon2D::operator()(this_00,idx + 1);
    }
    dVar3 = pVVar6->m_data[0];
    dVar4 = pVVar6->m_data[1];
    toEigen(&local_50,&this->A);
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[local_50.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value * idx] = dVar4 - dVar2;
    (local_50.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
     .
     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
     .m_data +
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value * idx)[1] = dVar1 - dVar3;
    pdVar7 = (double *)iDynTree::VectorDynSize::operator()(&this->b,idx);
    *pdVar7 = dVar1 * dVar4 - dVar2 * dVar3;
    idx = idx + 1;
  }
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedBoundingBox.getNrOfVertices(),2);
        b.resize(projectedBoundingBox.getNrOfVertices());

        // We assume that the vertices in projectedBoundingBox are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedBoundingBox.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedBoundingBox(i);
            Vector2 p1;

            if ( i != projectedBoundingBox.getNrOfVertices()-1 )
            {
                p1 = projectedBoundingBox(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedBoundingBox(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }